

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O0

optional<int> slang::checkedSubS32(int32_t a,int32_t b)

{
  int local_1c;
  int32_t local_18;
  int32_t result;
  int32_t b_local;
  int32_t a_local;
  
  local_1c = a - b;
  local_18 = b;
  result = a;
  if (SBORROW4(a,b)) {
    std::optional<int>::optional((optional<int> *)&b_local);
  }
  else {
    _b_local = (_Optional_payload_base<int>)std::make_optional<int&>(&local_1c);
  }
  return (optional<int>)_b_local;
}

Assistant:

inline std::optional<int32_t> checkedSubS32(int32_t a, int32_t b) {
#if defined(_MSC_VER)
    int64_t p = int64_t(a) - int64_t(b);
    bool fits = p >= std::numeric_limits<int32_t>::min() &&
                p <= std::numeric_limits<int32_t>::max();
    return fits ? std::make_optional(int32_t(p)) : std::nullopt;
#else
    int32_t result;
    return __builtin_sub_overflow(a, b, &result) ? std::nullopt : std::make_optional(result);
#endif
}